

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

void __thiscall
embree::TutorialApplication::motionFunc
          (TutorialApplication *this,GLFWwindow *window,double x,double y)

{
  ImGuiIO *pIVar1;
  GLFWwindow *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  float dClickY;
  float dClickX;
  Camera *in_stack_00000038;
  float in_stack_00000150;
  float in_stack_00000154;
  Camera *in_stack_00000158;
  
  ImGui_ImplGlfw_CursorPosCallback(in_RSI,in_XMM0_Qa,in_XMM1_Qa);
  pIVar1 = ImGui::GetIO();
  if ((pIVar1->WantCaptureMouse & 1U) == 0) {
    *(double *)(in_RDI + 0x1a0) = in_XMM0_Qa;
    *(double *)(in_RDI + 0x1a8) = in_XMM1_Qa;
    switch(*(undefined4 *)(in_RDI + 0x198)) {
    case 1:
      Camera::rotateOrbit(in_stack_00000158,in_stack_00000154,in_stack_00000150);
      break;
    case 2:
      break;
    case 3:
      Camera::dolly(in_stack_00000038,this._4_4_);
      break;
    case 4:
      Camera::rotate(in_stack_00000158,in_stack_00000154,in_stack_00000150);
    }
  }
  return;
}

Assistant:

void TutorialApplication::motionFunc(GLFWwindow* window, double x, double y)
  {
    ImGui_ImplGlfw_CursorPosCallback(window, x, y);
    if (ImGui::GetIO().WantCaptureMouse) return;
  
    float dClickX = float(clickX - x), dClickY = float(clickY - y);
    clickX = x; clickY = y;

    switch (mouseMode) {
    case 1: camera.rotateOrbit(-0.005f*dClickX,0.005f*dClickY); break;
    case 2: break;
    case 3: camera.dolly(-dClickY); break;
    case 4: camera.rotate(-0.005f*dClickX,0.005f*dClickY); break;
    }
  }